

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O1

string * __thiscall
sc_core::sc_vector_base::make_name_abi_cxx11_
          (string *__return_storage_ptr__,sc_vector_base *this,char *prefix,size_type param_2)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = sc_gen_unique_name((char *)this,false);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string
sc_vector_base::make_name( const char* prefix, size_type /* idx */ )
{
  // TODO: How to handle name clashes due to interleaved vector
  //       creation and init()?
  //       sc_vector< foo > v1, v2;
  //       v1.name() == "vector", v2.name() == "vector_0"
  //       v1.init( 1 ); -> v1[0].name() == "vector_0" -> clash
  return sc_gen_unique_name( prefix );
}